

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFile.c
# Opt level: O1

deFileResult deFile_write(deFile *file,void *buf,deInt64 bufSize,deInt64 *numWrittenPtr)

{
  deFileResult dVar1;
  ssize_t sVar2;
  int *piVar3;
  
  sVar2 = write(file->fd,buf,bufSize);
  if (numWrittenPtr != (deInt64 *)0x0) {
    *numWrittenPtr = sVar2;
  }
  dVar1 = DE_FILERESULT_SUCCESS;
  if (sVar2 < 1) {
    if (sVar2 == 0) {
      dVar1 = DE_FILERESULT_END_OF_FILE;
    }
    else {
      piVar3 = __errno_location();
      dVar1 = *piVar3 == 0xb ^ DE_FILERESULT_ERROR;
    }
  }
  return dVar1;
}

Assistant:

deFileResult deFile_write (deFile* file, const void* buf, deInt64 bufSize, deInt64* numWrittenPtr)
{
	deInt64 numWritten = write(file->fd, buf, (size_t)bufSize);

	if (numWrittenPtr)
		*numWrittenPtr = numWritten;

	return mapReadWriteResult(numWritten);
}